

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::trimr(basic_substring<const_char> *this,char c)

{
  basic_substring<const_char> bVar1;
  error_flags eVar2;
  size_t sVar3;
  ulong uVar4;
  basic_substring<const_char> *in_RDI;
  bool bVar5;
  size_t pos;
  size_t rnum_1;
  size_t rnum;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined2 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffeba;
  undefined1 in_stack_fffffffffffffebb;
  undefined4 in_stack_fffffffffffffebc;
  basic_substring<const_char> *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  ulong local_128;
  char *local_d8;
  size_t local_d0;
  char *local_70;
  size_t local_68;
  char *local_10;
  size_t local_8;
  
  bVar5 = true;
  if (in_RDI->len != 0) {
    bVar5 = in_RDI->str == (char *)0x0;
  }
  if ((bVar5) ||
     (sVar3 = last_not_of((basic_substring<const_char> *)
                          CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                          (char)((ulong)in_stack_fffffffffffffec0 >> 0x38),
                          CONCAT44(in_stack_fffffffffffffebc,
                                   CONCAT13(in_stack_fffffffffffffebb,
                                            CONCAT12(in_stack_fffffffffffffeba,
                                                     in_stack_fffffffffffffeb8)))),
     sVar3 == 0xffffffffffffffff)) {
    basic_substring(in_RDI,(char *)CONCAT44(in_stack_fffffffffffffebc,
                                            CONCAT13(in_stack_fffffffffffffebb,
                                                     CONCAT12(1,in_stack_fffffffffffffeb8))),
                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    local_d8 = local_70;
    local_d0 = local_68;
  }
  else {
    uVar4 = sVar3 + 1;
    if (in_RDI->len < uVar4 && uVar4 != 0xffffffffffffffff) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      handle_error(0x345f1b,(char *)0x153b,"check failed: %s",
                   "(num >= 0 && num <= len) || (num == npos)");
    }
    local_128 = uVar4;
    if (uVar4 == 0xffffffffffffffff) {
      local_128 = in_RDI->len;
    }
    if (in_RDI->len < local_128 && uVar4 != 0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      handle_error(0x345f1b,(char *)0x153d,"check failed: %s",
                   "(first >= 0 && first + rnum <= len) || (num == 0)");
    }
    basic_substring(in_stack_fffffffffffffec0,
                    (char *)CONCAT44(in_stack_fffffffffffffebc,
                                     CONCAT13(in_stack_fffffffffffffebb,
                                              CONCAT12(in_stack_fffffffffffffeba,
                                                       in_stack_fffffffffffffeb8))),
                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    local_d8 = local_10;
    local_d0 = local_8;
  }
  bVar1.len = local_d0;
  bVar1.str = local_d8;
  return bVar1;
}

Assistant:

basic_substring trimr(const C c) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(c, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }